

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O2

void Server::process_body(single_connection *conn)

{
  value_type *__x;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_d0;
  char acStack_a8 [8];
  char value [32];
  string key_str;
  char key [32];
  
  puts("------ REQUEST BODY PARSING START ------ ");
  conn->state = 0x10;
  if (conn->query_start_index == conn->query_end_index) {
    pcVar5 = "[WARN] HTTP request content is empty ";
  }
  else {
    iVar1 = strcmp(conn->method,"GET");
    if (iVar1 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&post_list_abi_cxx11_);
      value._24_8_ = &key_str._M_string_length;
      key_str._M_dataplus._M_p = (pointer)0x0;
      key_str._M_string_length._0_1_ = 0;
      pcVar4 = conn->querybuf + conn->data_len;
      pcVar6 = conn->querybuf + conn->query_start_index;
      __x = (value_type *)(value + 0x18);
      pcVar5 = pcVar6;
      while( true ) {
        key_str.field_2._8_8_ = 0;
        acStack_a8[0] = '\0';
        acStack_a8[1] = '\0';
        acStack_a8[2] = '\0';
        acStack_a8[3] = '\0';
        acStack_a8[4] = '\0';
        acStack_a8[5] = '\0';
        acStack_a8[6] = '\0';
        acStack_a8[7] = '\0';
        value[0] = '\0';
        value[1] = '\0';
        value[2] = '\0';
        value[3] = '\0';
        value[4] = '\0';
        value[5] = '\0';
        value[6] = '\0';
        value[7] = '\0';
        value[8] = '\0';
        value[9] = '\0';
        value[10] = '\0';
        value[0xb] = '\0';
        value[0xc] = '\0';
        value[0xd] = '\0';
        value[0xe] = '\0';
        value[0xf] = '\0';
        value[0x10] = '\0';
        value[0x11] = '\0';
        value[0x12] = '\0';
        value[0x13] = '\0';
        value[0x14] = '\0';
        value[0x15] = '\0';
        value[0x16] = '\0';
        value[0x17] = '\0';
        pcVar6 = strchr(pcVar6 + 1,0x3d);
        if ((pcVar6 == (char *)0x0) || (pcVar4 == pcVar6 || (long)pcVar4 - (long)pcVar6 < 0)) break;
        pcVar5 = strchr(pcVar5 + 1,0x26);
        strncpy(key_str.field_2._M_local_buf + 8,pcVar6 + 1,(long)(int)(~(uint)pcVar6 + (int)pcVar5)
               );
        std::__cxx11::string::assign((char *)__x);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&post_list_abi_cxx11_,__x);
        pcVar6 = strchr(pcVar6 + 1,0x3d);
        pcVar3 = strchr(pcVar5 + 1,0x26);
        pcVar5 = pcVar3;
        if (pcVar4 == pcVar3 || (long)pcVar4 - (long)pcVar3 < 0) {
          pcVar5 = pcVar4;
        }
        if (pcVar3 == (char *)0x0) {
          pcVar5 = pcVar4;
        }
        strncpy(acStack_a8,pcVar6 + 1,(long)(int)(~(uint)pcVar6 + (int)pcVar5));
        uVar2 = atoi(acStack_a8);
        printf("[INFO] Insert into the map: key = %s, value = %d \n",
               (undefined1 *)((long)&key_str.field_2 + 8),(ulong)uVar2);
        std::__cxx11::string::string((string *)&local_d0,(string *)__x);
        local_d0.second = uVar2;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    *)&data_map_abi_cxx11_,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      std::__cxx11::string::~string((string *)(value + 0x18));
      goto LAB_00105836;
    }
    pcVar5 = "[WARN] Skip parsing HTTP request content ";
  }
  puts(pcVar5);
LAB_00105836:
  conn->state = 0x20;
  conn->query_start_index = 0;
  conn->query_end_index = 0;
  conn->write_event->handler = send_response;
  conn->read_event->handler = empty_event_handler;
  Epoll_Event_Op::epoll_mod_event(conn,0xc);
  puts("------ REQUEST BODY PARSING END ------ ");
  return;
}

Assistant:

void Server::process_body(single_connection *conn)
{
    printf("------ REQUEST BODY PARSING START ------ \n");

    /* 更新连接状态为QUERY_BODY */
    conn->state = QUERY_BODY;

    /* 判断可选消息体是否为空 */
    if (conn->query_start_index == conn->query_end_index)
    {
        printf("[WARN] HTTP request content is empty \n");
    }
    else
    {
        /* 请求方法若为GET则忽略请求体 */
        if (strcmp(conn->method, "GET") == 0)
        {
            printf("[WARN] Skip parsing HTTP request content \n");
        }
        /* 请求方法若为POST则需要解析请求体 */
        else
        {
            /* 清空post_list */
            post_list.clear();
            /* key */
            string key_str;
            char key[32];
            /* value */
            int value_int;
            char value[32];
            /* 键或值的长度 */
            int len;
            /* 可选消息体的末尾地址 */
            char *ptr = conn->querybuf + conn->data_len;
            /* find_equ定位“=”的位置 */
            char *find_equ = conn->querybuf + conn->query_start_index;
            /* find_and定位“&”的位置 */
            char *find_and = conn->querybuf + conn->query_start_index;
            while (true)
            {
                memset(key, '\0', sizeof(key));
                memset(value, '\0', sizeof(value));
                /* 定位“=”的位置 */
                find_equ = strpbrk(find_equ + 1, "=");
                /* 所找寻的“=”超出该行范围，退出循环 */
                if ((find_equ == NULL) || (ptr - find_equ <= 0))
                {
                    break;
                }
                /* 定位“&”的位置 */
                find_and = strpbrk(find_and + 1, "&");
                /* 键的长度 */
                len = find_and - find_equ - 1;
                /* 拷贝key值到key字符数组 */
                strncpy(key, find_equ + 1, len);
                key_str = key;
                /* 将键放入post_list以进行后续输出 */
                post_list.push_back(key_str);
                /* 定位“=”的位置 */
                find_equ = strpbrk(find_equ + 1, "=");
                /* 定位“&”的位置 */
                find_and = strpbrk(find_and + 1, "&");
                /* 所找寻的“=”超出该行范围，退出循环 */
                if ((find_and == NULL) || (ptr - find_and <= 0))
                {
                    find_and = ptr;
                }
                /* 值的长度 */
                len = find_and - find_equ - 1;
                /* 拷贝value值到value字符数组 */
                strncpy(value, find_equ + 1, len);
                /* value由字符数组转换为整形 */
                value_int = atoi(value);

                printf("[INFO] Insert into the map: key = %s, value = %d \n", key, value_int);

                /* 向map中插入键值对 */
                data_map.insert(make_pair(key_str, value_int));
            }
        }
    }

    /* 修改该连接状态为SEND_DATA */
    conn->state = SEND_DATA;
    /* 重置起始偏移量以及末尾指针 */
    conn->query_start_index = conn->query_end_index = 0;
    /* 设置该连接写事件回调函数为send_response */
    conn->write_event->handler = send_response;
    /* 设置该连接读事件回调函数为空 */
    conn->read_event->handler = empty_event_handler;
    /* 修改epoll事件为EPOLLOUT */
    Epoll_Event_Op::epoll_mod_event(conn, EPOLLOUT | EPOLLERR);

    printf("------ REQUEST BODY PARSING END ------ \n");
}